

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O3

void blowfish_ssh2_decrypt_blk(ssh_cipher *cipher,void *blk,int len)

{
  uint uVar1;
  undefined1 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t out [2];
  uint local_48;
  uint local_44;
  ssh_cipher *local_40;
  BlowfishContext *local_38;
  
  if ((len & 7U) != 0) {
    __assert_fail("(len & 7) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/blowfish.c"
                  ,0x199,"void blowfish_msb_decrypt_cbc(unsigned char *, int, BlowfishContext *)");
  }
  uVar6 = *(uint *)&cipher[-1].vt;
  uVar5 = *(uint *)((long)&cipher[-1].vt + 4);
  local_40 = cipher;
  if (0 < len) {
    local_38 = (BlowfishContext *)(cipher + -0x20a);
    puVar2 = (undefined1 *)((long)blk + 7);
    uVar3 = len + 8;
    uVar4 = uVar6;
    uVar1 = uVar5;
    do {
      uVar6 = *(uint *)(puVar2 + -7);
      uVar5 = *(uint *)(puVar2 + -3);
      uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      blowfish_decrypt(uVar6,uVar5,&local_48,local_38);
      uVar4 = uVar4 ^ local_48;
      uVar1 = uVar1 ^ local_44;
      *(ushort *)(puVar2 + -5) = (ushort)uVar4 << 8 | (ushort)uVar4 >> 8;
      puVar2[-6] = (char)(uVar4 >> 0x10);
      puVar2[-7] = (char)(uVar4 >> 0x18);
      *puVar2 = (char)uVar1;
      puVar2[-1] = (char)(uVar1 >> 8);
      puVar2[-2] = (char)(uVar1 >> 0x10);
      puVar2[-3] = (char)(uVar1 >> 0x18);
      puVar2 = puVar2 + 8;
      uVar3 = uVar3 - 8;
      uVar4 = uVar6;
      uVar1 = uVar5;
    } while (8 < uVar3);
  }
  *(uint *)&local_40[-1].vt = uVar6;
  *(uint *)((long)&local_40[-1].vt + 4) = uVar5;
  return;
}

Assistant:

static void blowfish_ssh2_decrypt_blk(ssh_cipher *cipher, void *blk, int len)
{
    struct blowfish_ctx *ctx = container_of(cipher, struct blowfish_ctx, ciph);
    blowfish_msb_decrypt_cbc(blk, len, &ctx->context);
}